

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

float ImGui::GetColumnOffset(int column_index)

{
  ImGuiColumnsSet *pIVar1;
  
  pIVar1 = (GImGui->CurrentWindow->DC).ColumnsSet;
  if (column_index < 0) {
    column_index = pIVar1->Current;
  }
  return (pIVar1->MaxX - pIVar1->MinX) * (pIVar1->Columns).Data[column_index].OffsetNorm +
         pIVar1->MinX;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindowRead()      { ImGuiContext& g = *GImGui; return g.CurrentWindow; }